

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clnt_vc.c
# Opt level: O0

_Bool clnt_vc_control(CLIENT *clnt,u_int request,void *info)

{
  rpc_dplx_rec *rec_00;
  uint32_t uVar1;
  _Bool local_49;
  _Bool rslt;
  u_int32_t *uint32p;
  netbuf *addr;
  rpc_dplx_rec *rec;
  ct_data *ct;
  cx_data *cx;
  void *info_local;
  u_int request_local;
  CLIENT *clnt_local;
  
  rec_00 = (rpc_dplx_rec *)clnt[1].cl_ops;
  local_49 = true;
  rpc_dplx_rlt(rec_00,"clnt_vc_control",0x165);
  pthread_mutex_lock((pthread_mutex_t *)&clnt->cl_lock);
  if (request == 8) {
    atomic_set_uint16_t_bits(&(rec_00->xprt).xp_flags,0x10);
  }
  else if (request == 9) {
    atomic_clear_uint16_t_bits(&(rec_00->xprt).xp_flags,0x10);
  }
  else if (info == (void *)0x0) {
    local_49 = false;
  }
  else {
    switch(request) {
    case 3:
      memcpy(info,&clnt[1].cl_lock,(long)*(int *)((long)&clnt[2].cl_lock + 0x18));
      break;
    default:
      local_49 = false;
      break;
    case 6:
      *(int *)info = (rec_00->xprt).xp_fd;
      break;
    case 7:
      *(pthread_mutex_t **)((long)info + 8) = &clnt[1].cl_lock;
      *(undefined4 *)((long)info + 4) = *(undefined4 *)((long)&clnt[2].cl_lock + 0x18);
      *(undefined4 *)info = 0x80;
      break;
    case 10:
      uVar1 = ntohl(*(uint32_t *)&clnt[1].cl_netid);
      *(uint32_t *)info = uVar1;
      break;
    case 0xb:
      uVar1 = htonl(*info - 1);
      rec_00->call_xid = uVar1;
      break;
    case 0xc:
      uVar1 = ntohl(*(uint32_t *)&clnt[1].cl_u1);
      *(uint32_t *)info = uVar1;
      break;
    case 0xd:
      uVar1 = htonl(*info);
      *(uint32_t *)&clnt[1].cl_u1 = uVar1;
      break;
    case 0xe:
      uVar1 = ntohl(*(uint32_t *)((long)&clnt[1].cl_tp + 4));
      *(uint32_t *)info = uVar1;
      break;
    case 0xf:
      uVar1 = htonl(*info);
      *(uint32_t *)((long)&clnt[1].cl_tp + 4) = uVar1;
    }
  }
  rpc_dplx_rut(rec_00,"clnt_vc_control",0x1c2);
  pthread_mutex_unlock((pthread_mutex_t *)&clnt->cl_lock);
  return local_49;
}

Assistant:

static bool
clnt_vc_control(CLIENT *clnt, u_int request, void *info)
{
	struct cx_data *cx = CX_DATA(clnt);
	struct ct_data *ct = CT_DATA(cx);
	struct rpc_dplx_rec *rec = cx->cx_rec;
	struct netbuf *addr;
	u_int32_t *uint32p;
	bool rslt = true;

	/* always take recv lock first if taking together */
	rpc_dplx_rli(rec);
	mutex_lock(&clnt->cl_lock);

	/*
	 * By default, SVC_XPRT_FLAG_CLOSE is always false. It is user
	 * responsibility to do a close on the fd, or set by cl_control.
	 */
	switch (request) {
	case CLSET_FD_CLOSE:
		(void)atomic_set_uint16_t_bits(&rec->xprt.xp_flags,
						SVC_XPRT_FLAG_CLOSE);
		goto unlock;
	case CLSET_FD_NCLOSE:
		(void)atomic_clear_uint16_t_bits(&rec->xprt.xp_flags,
						SVC_XPRT_FLAG_CLOSE);
		goto unlock;
	default:
		break;
	}

	/* for other requests which use info */
	if (info == NULL) {
		rslt = false;
		goto unlock;
	}
	switch (request) {
	case CLGET_SERVER_ADDR:
		/* Now obsolete. Only for backward compatibility */
		(void)memcpy(info, &ct->ct_raddr, (size_t) ct->ct_rlen);
		break;
	case CLGET_FD:
		*(int *)info = rec->xprt.xp_fd;
		break;
	case CLGET_SVC_ADDR:
		/* The caller should not free this memory area */
		addr = (struct netbuf *)info;
		addr->buf = &ct->ct_raddr;
		addr->len = ct->ct_rlen;
		addr->maxlen = sizeof(ct->ct_raddr);
		break;

	case CLGET_XID:
		/*
		 * use the knowledge that xid is the
		 * first element in the call structure
		 * This will get the xid of the PREVIOUS call
		 */
		uint32p = (u_int32_t *)&cx->cx_mcallc[0];
		*(u_int32_t *)info = ntohl(*uint32p);
		break;

	case CLSET_XID:
		/* This will set the xid of the NEXT call */
		rec->call_xid = htonl(*(u_int32_t *) info - 1);
		/* decrement by 1 as clnt_req_setup() increments once */
		break;

	case CLGET_VERS:
		/*
		 * This RELIES on the information that, in the call body,
		 * the version number field is the fifth field from the
		 * beginning of the RPC header.
		 */
		uint32p = (u_int32_t *)&cx->cx_mcallc[4 * BYTES_PER_XDR_UNIT];
		*(u_int32_t *)info = ntohl(*uint32p);
		break;

	case CLSET_VERS:
		uint32p = (u_int32_t *)&cx->cx_mcallc[4 * BYTES_PER_XDR_UNIT];
		*uint32p = htonl(*(u_int32_t *)info);
		break;

	case CLGET_PROG:
		/*
		 * This RELIES on the information that, in the call body,
		 * the program number field is the fourth field from the
		 * beginning of the RPC header.
		 */
		uint32p = (u_int32_t *)&cx->cx_mcallc[3 * BYTES_PER_XDR_UNIT];
		*(u_int32_t *)info = ntohl(*uint32p);
		break;

	case CLSET_PROG:
		uint32p = (u_int32_t *)&cx->cx_mcallc[3 * BYTES_PER_XDR_UNIT];
		*uint32p = htonl(*(u_int32_t *)info);
		break;

	default:
		rslt = false;
		break;
	}

 unlock:
	rpc_dplx_rui(rec);
	mutex_unlock(&clnt->cl_lock);

	return (rslt);
}